

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t cab_next_cfdata(archive_read *a)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  long lVar4;
  uint *puVar5;
  int64_t iVar6;
  undefined4 *__src;
  void *pvVar7;
  char *fmt;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uchar *p;
  
  pvVar3 = a->format->data;
  lVar4 = *(long *)((long)pvVar3 + 0x38);
  if (lVar4 == 0) {
    puVar5 = *(uint **)((long)pvVar3 + 0x28);
    puVar5[0x16] = 0;
    lVar9 = (ulong)*puVar5 - *(long *)((long)pvVar3 + 0x40);
    if (lVar9 < 0) {
      uVar1 = *(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10);
      uVar10 = 0;
      if ((uVar1 != 0xfffd) && (uVar1 != 0xffff)) {
        if (uVar1 == 0xfffe) {
          uVar10 = (ulong)(*(ushort *)((long)pvVar3 + 0x50) - 1);
        }
        else {
          uVar10 = (ulong)(uint)uVar1;
        }
      }
      archive_set_error(&a->archive,-1,"Invalid offset of CFDATA in folder(%d) %jd < %jd",uVar10);
      return L'\xffffffe2';
    }
    if (lVar9 != 0) {
      iVar6 = __archive_read_consume(a,lVar9);
      if (iVar6 < 0) {
        return L'\xffffffe2';
      }
      *(ulong *)((long)pvVar3 + 0x40) = (ulong)**(uint **)((long)pvVar3 + 0x28);
    }
  }
  else if (*(short *)(lVar4 + 10) != 0) {
    return L'\0';
  }
  lVar9 = *(long *)((long)pvVar3 + 0x28);
  if ((int)(uint)*(ushort *)(lVar9 + 4) <= *(int *)(lVar9 + 0x58)) {
    if (*(ushort *)(lVar9 + 4) != 0) {
      *(undefined8 *)(lVar4 + 4) = 0;
      return L'\0';
    }
    *(long *)((long)pvVar3 + 0x38) = lVar9 + 0x18;
    *(undefined8 *)(lVar9 + 0x48) = 0;
    *(undefined8 *)(lVar9 + 0x50) = 0;
    *(undefined8 *)(lVar9 + 0x38) = 0;
    *(undefined8 *)(lVar9 + 0x40) = 0;
    *(undefined8 *)(lVar9 + 0x28) = 0;
    *(undefined8 *)(lVar9 + 0x30) = 0;
    *(undefined8 *)(lVar9 + 0x18) = 0;
    *(undefined8 *)(lVar9 + 0x20) = 0;
    return L'\0';
  }
  *(int *)(lVar9 + 0x58) = *(int *)(lVar9 + 0x58) + 1;
  *(long *)((long)pvVar3 + 0x38) = lVar9 + 0x18;
  *(undefined4 *)(lVar9 + 0x40) = 0;
  *(undefined4 *)(lVar9 + 0x48) = 0;
  *(undefined8 *)(lVar9 + 0x50) = 0;
  uVar10 = 8;
  if ((*(byte *)((long)pvVar3 + 0x54) & 4) != 0) {
    uVar10 = (ulong)*(byte *)((long)pvVar3 + 0x5d) + 8;
  }
  __src = (undefined4 *)__archive_read_ahead(a,uVar10,(ssize_t *)0x0);
  if (__src == (undefined4 *)0x0) {
    fmt = "Truncated CAB header";
    iVar8 = 0x54;
LAB_00238c8b:
    archive_set_error(&a->archive,iVar8,fmt);
    iVar8 = 1;
  }
  else {
    *(undefined4 *)(lVar9 + 0x18) = *__src;
    uVar1 = *(ushort *)(__src + 1);
    *(ushort *)(lVar9 + 0x1c) = uVar1;
    *(ushort *)(lVar9 + 0x1e) = uVar1;
    uVar2 = *(ushort *)((long)__src + 6);
    *(ushort *)(lVar9 + 0x20) = uVar2;
    *(ushort *)(lVar9 + 0x22) = uVar2;
    *(undefined4 *)(lVar9 + 0x24) = 0;
    *(undefined8 *)(lVar9 + 0x28) = 0;
    iVar8 = 3;
    if ((((((ushort)(uVar1 + 0x67ff) < 0x6800) || (0x8000 < uVar2)) ||
         ((uVar2 == 0 && (*(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10) < 0xfffe)))) ||
        (lVar4 = *(long *)((long)pvVar3 + 0x28),
        *(int *)(lVar4 + 0x58) < (int)(uint)*(ushort *)(lVar4 + 4))) ||
       ((*(short *)(lVar4 + 6) == 0 && (uVar1 != uVar2)))) goto LAB_00238c97;
    if (*(ulong *)(lVar9 + 0x30) < uVar10) {
      free(*(void **)(lVar9 + 0x38));
      pvVar7 = malloc(uVar10);
      *(void **)(lVar9 + 0x38) = pvVar7;
      if (pvVar7 == (void *)0x0) {
        fmt = "Can\'t allocate memory for CAB data";
        iVar8 = 0xc;
        goto LAB_00238c8b;
      }
      *(ulong *)(lVar9 + 0x30) = uVar10;
    }
    memcpy(*(void **)(lVar9 + 0x38),__src,uVar10);
    __archive_read_consume(a,uVar10);
    *(long *)((long)pvVar3 + 0x40) = *(long *)((long)pvVar3 + 0x40) + uVar10;
    iVar8 = 0;
  }
LAB_00238c97:
  if (iVar8 == 0) {
    return L'\0';
  }
  if (iVar8 == 3) {
    archive_set_error(&a->archive,0x54,"Invalid CFDATA");
    return L'\xffffffe2';
  }
  return L'\xffffffe2';
}

Assistant:

static int
cab_next_cfdata(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata = cab->entry_cfdata;

	/* There are remaining bytes in current CFDATA, use it first. */
	if (cfdata != NULL && cfdata->uncompressed_bytes_remaining > 0)
		return (ARCHIVE_OK);

	if (cfdata == NULL) {
		int64_t skip;

		cab->entry_cffolder->cfdata_index = 0;

		/* Seek read pointer to the offset of CFDATA if needed. */
		skip = cab->entry_cffolder->cfdata_offset_in_cab
			- cab->cab_offset;
		if (skip < 0) {
			int folder_index;
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_FROM_PREV:
			case iFoldCONTINUED_PREV_AND_NEXT:
				folder_index = 0;
				break;
			case iFoldCONTINUED_TO_NEXT:
				folder_index = cab->cfheader.folder_count-1;
				break;
			default:
				folder_index = cab->entry_cffile->folder;
				break;
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid offset of CFDATA in folder(%d) %jd < %jd",
			    folder_index,
			    (intmax_t)cab->entry_cffolder->cfdata_offset_in_cab,
			    (intmax_t)cab->cab_offset);
			return (ARCHIVE_FATAL);
		}
		if (skip > 0) {
			if (__archive_read_consume(a, skip) < 0)
				return (ARCHIVE_FATAL);
			cab->cab_offset =
			    cab->entry_cffolder->cfdata_offset_in_cab;
		}
	}

	/*
	 * Read a CFDATA.
	 */
	if (cab->entry_cffolder->cfdata_index <
	    cab->entry_cffolder->cfdata_count) {
		const unsigned char *p;
		int l;

		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cffolder->cfdata_index++;
		cab->entry_cfdata = cfdata;
		cfdata->sum_calculated = 0;
		cfdata->sum_extra_avail = 0;
		cfdata->sum_ptr = NULL;
		l = 8;
		if (cab->cfheader.flags & RESERVE_PRESENT)
			l += cab->cfheader.cfdata;
		if ((p = __archive_read_ahead(a, l, NULL)) == NULL)
			return (truncated_error(a));
		cfdata->sum = archive_le32dec(p + CFDATA_csum);
		cfdata->compressed_size = archive_le16dec(p + CFDATA_cbData);
		cfdata->compressed_bytes_remaining = cfdata->compressed_size;
		cfdata->uncompressed_size =
		    archive_le16dec(p + CFDATA_cbUncomp);
		cfdata->uncompressed_bytes_remaining =
		    cfdata->uncompressed_size;
		cfdata->uncompressed_avail = 0;
		cfdata->read_offset = 0;
		cfdata->unconsumed = 0;

		/*
		 * Sanity check if data size is acceptable.
		 */
		if (cfdata->compressed_size == 0 ||
		    cfdata->compressed_size > (0x8000+6144))
			goto invalid;
		if (cfdata->uncompressed_size > 0x8000)
			goto invalid;
		if (cfdata->uncompressed_size == 0) {
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_PREV_AND_NEXT:
			case iFoldCONTINUED_TO_NEXT:
				break;
			case iFoldCONTINUED_FROM_PREV:
			default:
				goto invalid;
			}
		}
		/* If CFDATA is not last in a folder, an uncompressed
		 * size must be 0x8000(32KBi) */
		if ((cab->entry_cffolder->cfdata_index <
		     cab->entry_cffolder->cfdata_count) &&
		       cfdata->uncompressed_size != 0x8000)
			goto invalid;

		/* A compressed data size and an uncompressed data size must
		 * be the same in no compression mode. */
		if (cab->entry_cffolder->comptype == COMPTYPE_NONE &&
		    cfdata->compressed_size != cfdata->uncompressed_size)
			goto invalid;

		/*
		 * Save CFDATA image for sum check.
		 */
		if (cfdata->memimage_size < (size_t)l) {
			free(cfdata->memimage);
			cfdata->memimage = malloc(l);
			if (cfdata->memimage == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for CAB data");
				return (ARCHIVE_FATAL);
			}
			cfdata->memimage_size = l;
		}
		memcpy(cfdata->memimage, p, l);

		/* Consume bytes as much as we used. */
		__archive_read_consume(a, l);
		cab->cab_offset += l;
	} else if (cab->entry_cffolder->cfdata_count > 0) {
		/* Run out of all CFDATA in a folder. */
		cfdata->compressed_size = 0;
		cfdata->uncompressed_size = 0;
		cfdata->compressed_bytes_remaining = 0;
		cfdata->uncompressed_bytes_remaining = 0;
	} else {
		/* Current folder does not have any CFDATA. */
		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cfdata = cfdata;
		memset(cfdata, 0, sizeof(*cfdata));
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CFDATA");
	return (ARCHIVE_FATAL);
}